

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Allocator.hpp
# Opt level: O2

char * memory::impl::aligned_malloc<char,8ul>(size_type size)

{
  int iVar1;
  void *in_RAX;
  void *ptr;
  
  ptr = in_RAX;
  iVar1 = posix_memalign(&ptr,8,size);
  if (iVar1 != 0) {
    ptr = (char *)0x0;
  }
  return (char *)ptr;
}

Assistant:

T* aligned_malloc(size_type size) {
        // double check that alignment is a multiple of sizeof(void*),
        // which is a prerequisite for posix_memalign()
        static_assert( !(alignment%sizeof(void*)),
                "alignment is not a multiple of sizeof(void*)");
        static_assert( is_power_of_two(alignment),
                "alignment is not a power of two");
        void *ptr;
        int result = posix_memalign(&ptr, alignment, size*sizeof(T));
        if(result) {
            return nullptr;
        }
        return reinterpret_cast<T*>(ptr);
    }